

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistence.h
# Opt level: O3

istream * GenApi_3_4::operator>>(istream *is,CFeatureBag *FeatureBag)

{
  istream iVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  gcstring *pgVar6;
  long lVar7;
  char *pcVar8;
  CSelectorState *pCVar9;
  ExceptionReporter<GenICam_3_4::RuntimeException> *pEVar10;
  CSelectorState *pSelectorState;
  gcstring selectorName;
  gcstring Name;
  gcstring MagicGUID;
  gcstring FirstLine;
  gcstring selectorValue;
  gcstring Value;
  ExceptionReporter<GenICam_3_4::RuntimeException> local_308;
  gcstring local_260 [80];
  gcstring local_210 [80];
  gcstring local_1c0 [80];
  gcstring local_170 [80];
  gcstring local_120 [80];
  gcstring local_d0 [80];
  gcstring local_80 [80];
  
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) != 0) {
    pEVar10 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/Persistence.h"
               ,0xe0,"RuntimeException");
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (pEVar10,(char *)&local_308,"The stream is eof");
    __cxa_throw(pEVar10,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::GenericException::~GenericException);
  }
  GenApi_3_4::CFeatureBag::Clear();
  GenICam_3_4::gcstring::gcstring(local_1c0);
  GenICam_3_4::gcstring::reserve((ulong)local_1c0);
  GenICam_3_4::getline((char **)is,(size_t *)local_1c0,(FILE *)0xa);
  GenICam_3_4::gcstring::gcstring(local_210,"{05D8C294-F295-4dfb-9D01-096BD04049F4}");
  lVar4 = GenICam_3_4::gcstring::_npos();
  lVar5 = GenICam_3_4::gcstring::find(local_1c0,(ulong)local_210);
  if (lVar4 == lVar5) {
    GenICam_3_4::gcstring::gcstring
              (&local_308.m_SourceFileName,"{4709CB3C-7322-4460-84C3-DA11DDA09939}");
    GenICam_3_4::gcstring::operator=(local_210,&local_308.m_SourceFileName);
    GenICam_3_4::gcstring::~gcstring(&local_308.m_SourceFileName);
    lVar4 = GenICam_3_4::gcstring::_npos();
    lVar5 = GenICam_3_4::gcstring::find(local_1c0,(ulong)local_210);
    pEVar10 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)__cxa_allocate_exception(0x1f0);
    if (lVar4 != lVar5) {
      GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                (&local_308,
                 "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/Persistence.h"
                 ,0xf1,"RuntimeException");
      GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                (pEVar10,(char *)&local_308,
                 "The stream has been created using the CFeatureBagger class thus must be restored using the CFeatureBagger class as well"
                );
      __cxa_throw(pEVar10,&GenICam_3_4::RuntimeException::typeinfo,
                  GenICam_3_4::GenericException::~GenericException);
    }
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
              (&local_308,
               "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/Persistence.h"
               ,0xef,"RuntimeException");
    GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
              (pEVar10,(char *)&local_308,
               "The stream is not a GenApi feature stream since it is missing the magic GUID in the first line"
              );
    __cxa_throw(pEVar10,&GenICam_3_4::RuntimeException::typeinfo,
                GenICam_3_4::GenericException::~GenericException);
  }
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0) {
    cVar2 = std::istream::peek();
    while (cVar2 == '#') {
      std::istream::ignore((long)is,0x400);
      cVar2 = std::istream::peek();
    }
  }
  GenICam_3_4::gcstring::gcstring(local_260);
  GenICam_3_4::gcstring::gcstring(local_120);
  GenICam_3_4::gcstring::reserve((ulong)local_260);
  GenICam_3_4::gcstring::reserve((ulong)local_120);
  if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0) {
    do {
      GenICam_3_4::getline((char **)is,(size_t *)local_260,(FILE *)0x9);
      if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) {
        pEVar10 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)
                  __cxa_allocate_exception(0x1f0);
        GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                  (&local_308,
                   "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/Persistence.h"
                   ,0xfe,"RuntimeException");
        GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                  (pEVar10,(char *)&local_308,"The stream holds excess data");
        __cxa_throw(pEVar10,&GenICam_3_4::RuntimeException::typeinfo,
                    GenICam_3_4::GenericException::~GenericException);
      }
      pgVar6 = TrimSpace(local_260,is);
      GenICam_3_4::gcstring::operator=(local_260,pgVar6);
      cVar2 = GenICam_3_4::gcstring::empty();
      if (cVar2 == '\0') {
        lVar4 = GenApi_3_4::CFeatureBag::AllocateSelector();
        if (lVar4 == 0) {
          pEVar10 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)
                    __cxa_allocate_exception(0x1f0);
          GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                    (&local_308,
                     "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/Persistence.h"
                     ,0x10b,"RuntimeException");
          GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                    (pEVar10,(char *)&local_308,"Unable to allocate SelectorState");
          __cxa_throw(pEVar10,&GenICam_3_4::RuntimeException::typeinfo,
                      GenICam_3_4::GenericException::~GenericException);
        }
        iVar3 = std::istream::peek();
        if (iVar3 == 0x7b) {
          GenICam_3_4::getline((char **)is,(size_t *)local_120,(FILE *)0x9);
          if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 5) != 0) break;
          cVar2 = (char)local_120;
          lVar5 = GenICam_3_4::gcstring::find_last_of(cVar2,0x3d);
          while (lVar7 = GenICam_3_4::gcstring::_npos(), lVar5 != lVar7) {
            lVar5 = GenICam_3_4::gcstring::find_last_of(cVar2,0x7d);
            GenICam_3_4::gcstring::operator_cast_to_char_(local_120);
            GenICam_3_4::gcstring::_npos();
            GenICam_3_4::gcstring::substr((ulong)&local_308,(ulong)local_120);
            GenICam_3_4::gcstring::substr((ulong)local_170,(ulong)local_120);
            GenICam_3_4::gcstring::gcstring(local_d0,&local_308.m_SourceFileName);
            GenICam_3_4::gcstring::gcstring(local_80,local_170);
            GenApi_3_4::CSelectorState::AddSelector(lVar4,local_d0,local_80);
            GenICam_3_4::gcstring::~gcstring(local_80);
            GenICam_3_4::gcstring::~gcstring(local_d0);
            lVar7 = GenICam_3_4::gcstring::_npos();
            if (lVar5 != lVar7) {
              GenICam_3_4::gcstring::~gcstring(local_170);
              GenICam_3_4::gcstring::~gcstring(&local_308.m_SourceFileName);
              break;
            }
            GenICam_3_4::getline((char **)is,(size_t *)local_120,(FILE *)0x9);
            iVar1 = is[*(long *)(*(long *)is + -0x18) + 0x20];
            GenICam_3_4::gcstring::~gcstring(local_170);
            GenICam_3_4::gcstring::~gcstring(&local_308.m_SourceFileName);
            if (((byte)iVar1 & 5) != 0) break;
            lVar5 = GenICam_3_4::gcstring::find_last_of(cVar2,0x3d);
          }
        }
        GenICam_3_4::getline((char **)is,(size_t *)local_120,(FILE *)0xa);
        cVar2 = GenICam_3_4::gcstring::empty();
        if (cVar2 != '\0') {
          GenApi_3_4::CFeatureBag::DeleteSelector((CSelectorState **)FeatureBag);
          pEVar10 = (ExceptionReporter<GenICam_3_4::RuntimeException> *)
                    __cxa_allocate_exception(0x1f0);
          GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::ExceptionReporter
                    (&local_308,
                     "/workspace/llm4binary/github/license_c_cmakelists/roboception[P]rc_genicam_api/genicam/library/CPP/include/GenApi/Persistence.h"
                     ,0x12f,"RuntimeException");
          GenICam_3_4::ExceptionReporter<GenICam_3_4::RuntimeException>::Report
                    (pEVar10,(char *)&local_308,"The stream holds incomplete key - value - set");
          __cxa_throw(pEVar10,&GenICam_3_4::RuntimeException::typeinfo,
                      GenICam_3_4::GenericException::~GenericException);
        }
        pcVar8 = (char *)GenICam_3_4::gcstring::c_str();
        pCVar9 = (CSelectorState *)GenICam_3_4::gcstring::c_str();
        GenApi_3_4::CFeatureBag::Push((char *)FeatureBag,pcVar8,pCVar9);
        if (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0) {
          cVar2 = std::istream::peek();
          while (cVar2 == '#') {
            std::istream::ignore((long)is,0x400);
            cVar2 = std::istream::peek();
          }
        }
      }
    } while (((byte)is[*(long *)(*(long *)is + -0x18) + 0x20] & 2) == 0);
  }
  GenICam_3_4::gcstring::~gcstring(local_120);
  GenICam_3_4::gcstring::~gcstring(local_260);
  GenICam_3_4::gcstring::~gcstring(local_210);
  GenICam_3_4::gcstring::~gcstring(local_1c0);
  return is;
}

Assistant:

inline std::istream& operator >>(std::istream &is, CFeatureBag &FeatureBag)
    {
        if( is.eof() )
        {
            throw RUNTIME_EXCEPTION("The stream is eof");
        }

        FeatureBag.Clear();

        GENICAM_NAMESPACE::gcstring FirstLine;
        FirstLine.reserve( 128 );
        GENICAM_NAMESPACE::getline( is, FirstLine, '\n' );
        // Check the magic
        GENICAM_NAMESPACE::gcstring MagicGUID(GENAPI_PERSISTENCE_MAGIC);
        if( GENICAM_NAMESPACE::gcstring::_npos() == FirstLine.find(MagicGUID) )
        {
            MagicGUID = GENICAM_NAMESPACE::gcstring(GENAPI_PERSISTENCE_MAGIC_FEATUREBAGGER);
            if( GENICAM_NAMESPACE::gcstring::_npos() == FirstLine.find(MagicGUID) )
            {
                throw RUNTIME_EXCEPTION("The stream is not a GenApi feature stream since it is missing the magic GUID in the first line");
            }
            throw RUNTIME_EXCEPTION("The stream has been created using the CFeatureBagger class thus must be restored using the CFeatureBagger class as well");
        }

        EatComments( is );

        GENICAM_NAMESPACE::gcstring Name, Value;
        Name.reserve( 128 );
        Value.reserve( 128 );
        while (!is.eof())
        {
            GENICAM_NAMESPACE::getline( is, Name, '\t' );
            if (is.fail())  // if reading from stream failed -> stop reading!
            {
                throw RUNTIME_EXCEPTION( "The stream holds excess data" );
                break;
            }

            Name = TrimSpace( Name, is );
            if (Name.empty())
            {
                continue;
            }

            CSelectorState *pSelectorState = FeatureBag.AllocateSelector();
            if (!pSelectorState)
            {
                throw RUNTIME_EXCEPTION( "Unable to allocate SelectorState" );
            }


            if (is.peek() == '{')
            {
                GENICAM_NAMESPACE::getline( is, Value, '\t' );
                if (is.fail())  // if reading from stream failed -> stop reading!
                {
                    break;
                }
                for (size_t iassign = Value.find_last_of( '=' ); iassign != GENICAM_NAMESPACE::gcstring::_npos(); iassign = Value.find_last_of( '=' ))
                {
                    const size_t iend = Value.find_last_of( '}');
                    const size_t ibeg = (Value[0] == '{') ? 1 : 0;
                    const size_t rhs_len = iend == GENICAM_NAMESPACE::gcstring::_npos() ? iend : iend - iassign - 1;
                    const size_t lhs_len = iassign - ibeg;
                    GENICAM_NAMESPACE::gcstring selectorName = Value.substr( ibeg, lhs_len );
                    GENICAM_NAMESPACE::gcstring selectorValue = Value.substr( iassign + 1, rhs_len );
                    pSelectorState->AddSelector( selectorName, selectorValue );
                    if (iend != GENICAM_NAMESPACE::gcstring::_npos())
                    {
                        break;
                    }

                    GENICAM_NAMESPACE::getline( is, Value, '\t' );
                    if (is.fail())
                    {
                        break;
                    }
                }
            }
            GENICAM_NAMESPACE::getline( is, Value, '\n' );
            if (Value.empty())
            {
                FeatureBag.DeleteSelector(pSelectorState);
                throw RUNTIME_EXCEPTION( "The stream holds incomplete key - value - set" );
            }
            FeatureBag.Push( Name.c_str(), Value.c_str(), pSelectorState );

            EatComments( is );
        }
        return is;
    }